

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.h
# Opt level: O0

uint __thiscall glsl_type::arrays_of_arrays_size(glsl_type *this)

{
  bool bVar1;
  glsl_type *local_28;
  glsl_type *base_type;
  uint size;
  glsl_type *this_local;
  
  bVar1 = is_array(this);
  if (bVar1) {
    base_type._4_4_ = this->length;
    local_28 = (this->fields).array;
    while( true ) {
      bVar1 = is_array(local_28);
      if (!bVar1) break;
      base_type._4_4_ = base_type._4_4_ * local_28->length;
      local_28 = (local_28->fields).array;
    }
    this_local._4_4_ = base_type._4_4_;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned arrays_of_arrays_size() const
   {
      if (!is_array())
         return 0;

      unsigned size = length;
      const glsl_type *base_type = fields.array;

      while (base_type->is_array()) {
         size = size * base_type->length;
         base_type = base_type->fields.array;
      }
      return size;
   }